

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<5U,_4U>::GoState(GoState<5U,_4U> *this,char (*board) [5])

{
  long in_RSI;
  long *in_RDI;
  int j;
  int i;
  GoState<5U,_4U> state;
  uint local_7c;
  uint local_78;
  GoState<5U,_4U> *in_stack_ffffffffffffffc0;
  
  *in_RDI = (long)&PTR__GoState_001f07b8;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x1b3c87);
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 1;
  GoState(in_stack_ffffffffffffffc0);
  for (local_78 = 0; local_78 < 5; local_78 = local_78 + 1) {
    for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
      if (*(char *)(in_RSI + (long)(int)local_78 * 5 + (long)(int)local_7c) == '1') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_78,local_7c,1);
      }
      else if (*(char *)(in_RSI + (long)(int)local_78 * 5 + (long)(int)local_7c) == '2') {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_78,local_7c,2);
      }
      else {
        (**(code **)(*in_RDI + 0x18))(in_RDI,local_78,local_7c,0);
      }
    }
  }
  ~GoState((GoState<5U,_4U> *)0x1b3dcd);
  return;
}

Assistant:

GoState(char board[M][N+1]):
		previous_board_hash_value(0),
		depth(0),
		player_to_move(1)
	{
		GoState<M, N> state;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (board[i][j] == '1') {
				set_pos(i, j, 1);
			}
			else if (board[i][j] == '2') {
				set_pos(i, j, 2);
			}
			else {
				set_pos(i, j, empty);
			}
		}}
	}